

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_IMULH_R(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  
  bVar1 = this->dst;
  bVar2 = this->src;
  poVar3 = std::operator<<(os,"r");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1 & 7);
  poVar3 = std::operator<<(poVar3,", r");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2 & 7);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Instruction::h_IMULH_R(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", r" << srcIndex << std::endl;
	}